

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.hpp
# Opt level: O1

void __thiscall helics::apps::Probe::~Probe(Probe *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  
  (this->super_App)._vptr_App = (_func_int **)&PTR__Probe_00522fb0;
  (this->endpoint).super_Interface._vptr_Interface = (_func_int **)&PTR__Endpoint_005221f8;
  pcVar3 = (this->endpoint).defDest._M_dataplus._M_p;
  paVar1 = &(this->endpoint).defDest.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  (this->endpoint).super_Interface._vptr_Interface = (_func_int **)&PTR__Interface_00525a48;
  pcVar4 = (this->endpoint).super_Interface.mName._M_dataplus._M_p;
  paVar2 = &(this->endpoint).super_Interface.mName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar2) {
    operator_delete(pcVar4,paVar2->_M_allocated_capacity + 1);
  }
  apps::App::~App(&this->super_App);
  operator_delete(this,0x120);
  return;
}

Assistant:

class HELICS_CXX_EXPORT Probe: public App {
  public:
    /** default constructor*/
    Probe() = default;
    /** construct from command line arguments in a vector
@param args The vector of string, the remaining arguments are returned in the args
*/
    explicit Probe(std::vector<std::string> args);
    /** construct from command line arguments
@param argc the number of arguments
@param argv the strings in the input
*/
    Probe(int argc, char* argv[]);
    /** construct from a federate info object
@param name the name of the source object (can be empty to use defaults from fedInfo)
@param fedInfo a pointer info object containing information on the desired federate configuration
*/
    Probe(std::string_view name, const FederateInfo& fedInfo);
    /**constructor taking a federate information structure and using the given core
@param name the name of the source object (can be empty to use defaults from fedInfo)
@param core a pointer to core object which the federate can join
@param fedInfo  a federate information structure
*/
    Probe(std::string_view name, const std::shared_ptr<Core>& core, const FederateInfo& fedInfo);

    /**constructor taking a federate information structure and using the given core
@param name the name of the federate (can be empty to use defaults from fedInfo)
@param core a coreApp object that can be joined
@param fedInfo  a federate information structure
*/
    Probe(std::string_view name, CoreApp& core, const FederateInfo& fedInfo);
    /**constructor taking a file with the required information
@param name the name of the source object (can be empty to use defaults from fedInfo)
@param configString file a JSON or TOML file or string containing configuration informatino
*/
    Probe(std::string_view name, const std::string& configString);

    /** move construction*/
    Probe(Probe&& other_source) = default;

    /** move assignment*/
    Probe& operator=(Probe&& fed) = default;

    /** initialize the source federate
@details connect all sources with a generator
*/
    virtual void initialize() override;

    /** run the source until the specified time
@param stopTime_input the desired stop time
*/
    virtual void runTo(Time stopTime_input) override;
    /** get the number of connections made*/
    int getConnections() const { return connections; }
    /** get the number of messages received*/
    int getMessageCount() const { return messagesReceived; }

  private:
    void runProbe();

    Endpoint endpoint;  //!< the actual endpoint objects
    int connections{0};  //!< count the number of connections
    int messagesReceived{0};  //!< count the number of messages received
}